

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O3

void __thiscall
wasm::EquivalentClass::merge
          (EquivalentClass *this,Module *module,
          vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *params)

{
  pointer pPVar1;
  pointer ppFVar2;
  Function *this_00;
  vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *in_R8;
  size_t index;
  ParamInfo *param;
  pointer this_01;
  Expression *local_80;
  Function *local_78;
  vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *local_70;
  vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *__range2;
  EquivalentClass *local_60;
  undefined1 auStack_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> extraArgs;
  Builder local_38;
  Builder builder;
  
  this_00 = (Function *)this;
  local_70 = params;
  __range2 = (vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *)
             createShared(this,module,params);
  ppFVar2 = (this->functions).
            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->functions).super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppFVar2) {
    index = 0;
    local_60 = this;
    do {
      local_78 = ppFVar2[index];
      auStack_58 = (undefined1  [8])0x0;
      extraArgs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      extraArgs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pPVar1 = (local_70->super__Vector_base<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      local_38.wasm = module;
      for (this_01 = (local_70->
                     super__Vector_base<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>)._M_impl.
                     super__Vector_impl_data._M_start; this_01 != pPVar1; this_01 = this_01 + 1) {
        local_80 = ParamInfo::lowerToExpression(this_01,&local_38,module,index);
        this_00 = (Function *)auStack_58;
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_58,
                   &local_80);
      }
      replaceWithThunk((EquivalentClass *)this_00,&local_38,local_78,(Function *)__range2,in_R8,
                       (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_58
                       ,(bool)((byte)(module->features).features >> 7));
      if (auStack_58 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_58,
                        (long)extraArgs.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
      }
      index = index + 1;
      ppFVar2 = (local_60->functions).
                super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      this_00 = (Function *)auStack_58;
    } while (index < (ulong)((long)(local_60->functions).
                                   super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3))
    ;
  }
  return;
}

Assistant:

void EquivalentClass::merge(Module* module,
                            const std::vector<ParamInfo>& params) {
  Function* sharedFn = createShared(module, params);
  for (size_t i = 0; i < functions.size(); ++i) {
    Builder builder(*module);
    auto* func = functions[i];
    std::vector<Expression*> extraArgs;
    for (auto& param : params) {
      extraArgs.push_back(param.lowerToExpression(builder, module, i));
    }
    replaceWithThunk(builder,
                     func,
                     sharedFn,
                     params,
                     extraArgs,
                     module->features.hasTailCall());
  }
  return;
}